

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgram.cpp
# Opt level: O0

int __thiscall zmq::dgram_t::xsend(dgram_t *this,msg_t *msg_)

{
  byte bVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  ulong uVar5;
  size_t in_RCX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  EVP_PKEY_CTX *in_RSI;
  EVP_PKEY_CTX *ctx;
  pipe_t *in_RDI;
  char *errstr_1;
  int rc;
  char *errstr;
  int rc_1;
  int local_4;
  
  if (in_RDI[5]._peers_msgs_read == 0) {
    iVar2 = msg_t::close((msg_t *)in_RSI,(int)in_RSI);
    if (iVar2 != 0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      fprintf(_stderr,"%s (%s:%d)\n",pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/dgram.cpp"
              ,0x62);
      fflush(_stderr);
      zmq_abort((char *)0x2f4b18);
    }
    local_4 = -1;
  }
  else {
    if (((ulong)in_RDI[5]._sink & 1) == 0) {
      bVar1 = msg_t::flags((msg_t *)in_RSI);
      __buf = extraout_RDX;
      if ((bVar1 & 1) == 0) {
        piVar3 = __errno_location();
        *piVar3 = 0x16;
        return -1;
      }
    }
    else {
      bVar1 = msg_t::flags((msg_t *)in_RSI);
      __buf = extraout_RDX_00;
      if ((bVar1 & 1) != 0) {
        piVar3 = __errno_location();
        *piVar3 = 0x16;
        return -1;
      }
    }
    ctx = in_RSI;
    uVar5 = pipe_t::write((pipe_t *)in_RDI[5]._peers_msgs_read,(int)in_RSI,__buf,in_RCX);
    if ((uVar5 & 1) == 0) {
      piVar3 = __errno_location();
      *piVar3 = 0xb;
      local_4 = -1;
    }
    else {
      bVar1 = msg_t::flags((msg_t *)in_RSI);
      if ((bVar1 & 1) == 0) {
        pipe_t::flush(in_RDI);
      }
      *(byte *)&in_RDI[5]._sink = (*(byte *)&in_RDI[5]._sink ^ 0xff) & 1;
      iVar2 = msg_t::init((msg_t *)in_RSI,ctx);
      if (iVar2 != 0) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        fprintf(_stderr,"%s (%s:%d)\n",pcVar4,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/dgram.cpp"
                ,0x83);
        fflush(_stderr);
        zmq_abort((char *)0x2f4c74);
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int zmq::dgram_t::xsend (msg_t *msg_)
{
    // If there's no out pipe, just drop it.
    if (!_pipe) {
        const int rc = msg_->close ();
        errno_assert (rc == 0);
        return -1;
    }

    //  If this is the first part of the message it's the ID of the
    //  peer to send the message to.
    if (!_more_out) {
        if (!(msg_->flags () & msg_t::more)) {
            errno = EINVAL;
            return -1;
        }
    } else {
        //  dgram messages are two part only, reject part if more is set
        if (msg_->flags () & msg_t::more) {
            errno = EINVAL;
            return -1;
        }
    }

    // Push the message into the pipe.
    if (!_pipe->write (msg_)) {
        errno = EAGAIN;
        return -1;
    }

    if (!(msg_->flags () & msg_t::more))
        _pipe->flush ();

    // flip the more flag
    _more_out = !_more_out;

    //  Detach the message from the data buffer.
    const int rc = msg_->init ();
    errno_assert (rc == 0);

    return 0;
}